

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::z_formatter<spdlog::details::scoped_padder>::format
          (z_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  char local_70 [11];
  bool is_negative;
  int local_5c;
  undefined1 local_58 [4];
  int total_minutes;
  scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *msg_local;
  z_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_ = 6;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_58,6,&(this->super_flag_formatter).padinfo_,dest);
  local_5c = get_cached_offset(this,msg,tm_time);
  local_70[3] = local_5c < 0;
  if ((bool)local_70[3]) {
    local_5c = -local_5c;
    local_70[2] = 0x2d;
    ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_70 + 2);
  }
  else {
    local_70[1] = 0x2b;
    ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_70 + 1);
  }
  fmt_helper::pad2(local_5c / 0x3c,dest);
  local_70[0] = ':';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_70);
  fmt_helper::pad2(local_5c % 0x3c,dest);
  scoped_padder::~scoped_padder((scoped_padder *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }